

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  ulong uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 (*pauVar32) [16];
  int iVar33;
  uint uVar34;
  uint uVar35;
  long lVar36;
  Scene *pSVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  undefined1 (*pauVar43) [16];
  undefined4 uVar44;
  ulong unaff_R12;
  ulong uVar45;
  ulong uVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar52 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 extraout_var [56];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar71 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar85;
  float fVar86;
  undefined1 auVar82 [16];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  float fVar99;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar103 [64];
  float fVar110;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar111 [32];
  float fVar115;
  float fVar118;
  float fVar119;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar121;
  float fVar122;
  undefined1 auVar120 [32];
  float fVar123;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar124 [32];
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar129 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 local_1590;
  undefined8 uStack_1588;
  undefined8 *local_1580;
  ulong local_1578;
  ulong local_1570;
  ulong local_1568;
  Scene *local_1560;
  undefined1 auStack_1558 [24];
  RTCFilterFunctionNArguments local_1530;
  undefined1 local_1500 [32];
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  float local_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float local_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float local_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [16];
  undefined1 local_13d0 [16];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  RTCHitN local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  uint local_1320;
  uint uStack_131c;
  uint uStack_1318;
  uint uStack_1314;
  uint uStack_1310;
  uint uStack_130c;
  uint uStack_1308;
  uint uStack_1304;
  undefined1 local_1300 [16];
  undefined4 uStack_12f0;
  undefined4 uStack_12ec;
  undefined4 uStack_12e8;
  undefined4 uStack_12e4;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  undefined4 uStack_11a4;
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  undefined1 local_1160 [32];
  undefined1 local_1140 [8];
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  undefined4 uStack_1124;
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar43 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar44 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_13d0._4_4_ = uVar44;
  local_13d0._0_4_ = uVar44;
  local_13d0._8_4_ = uVar44;
  local_13d0._12_4_ = uVar44;
  auVar96 = ZEXT1664(local_13d0);
  uVar44 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_13e0._4_4_ = uVar44;
  local_13e0._0_4_ = uVar44;
  local_13e0._8_4_ = uVar44;
  local_13e0._12_4_ = uVar44;
  auVar98 = ZEXT1664(local_13e0);
  uVar44 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_13f0._4_4_ = uVar44;
  local_13f0._0_4_ = uVar44;
  local_13f0._8_4_ = uVar44;
  local_13f0._12_4_ = uVar44;
  auVar103 = ZEXT1664(local_13f0);
  local_1430 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1440 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1450 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1400 = local_1430 * 0.99999964;
  local_1410 = local_1440 * 0.99999964;
  local_1420 = local_1450 * 0.99999964;
  local_1430 = local_1430 * 1.0000004;
  local_1440 = local_1440 * 1.0000004;
  local_1450 = local_1450 * 1.0000004;
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1568 = uVar38 ^ 0x10;
  local_1570 = uVar41 ^ 0x10;
  local_1578 = uVar42 ^ 0x10;
  iVar33 = (tray->tnear).field_0.i[k];
  local_14d0._4_4_ = iVar33;
  local_14d0._0_4_ = iVar33;
  local_14d0._8_4_ = iVar33;
  local_14d0._12_4_ = iVar33;
  auVar92 = ZEXT1664(local_14d0);
  iVar33 = (tray->tfar).field_0.i[k];
  auVar50 = ZEXT1664(CONCAT412(iVar33,CONCAT48(iVar33,CONCAT44(iVar33,iVar33))));
  local_1120._16_16_ = mm_lookupmask_ps._240_16_;
  local_1120._0_16_ = mm_lookupmask_ps._0_16_;
  local_1580 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar73._8_4_ = 0x3f800000;
  auVar73._0_8_ = &DAT_3f8000003f800000;
  auVar73._12_4_ = 0x3f800000;
  auVar73._16_4_ = 0x3f800000;
  auVar73._20_4_ = 0x3f800000;
  auVar73._24_4_ = 0x3f800000;
  auVar73._28_4_ = 0x3f800000;
  auVar55._8_4_ = 0xbf800000;
  auVar55._0_8_ = 0xbf800000bf800000;
  auVar55._12_4_ = 0xbf800000;
  auVar55._16_4_ = 0xbf800000;
  auVar55._20_4_ = 0xbf800000;
  auVar55._24_4_ = 0xbf800000;
  auVar55._28_4_ = 0xbf800000;
  _local_1140 = vblendvps_avx(auVar73,auVar55,local_1120);
  fVar110 = local_1400;
  fVar112 = local_1400;
  fVar113 = local_1400;
  fVar114 = local_1400;
  fVar115 = local_1410;
  fVar118 = local_1410;
  fVar119 = local_1410;
  fVar99 = local_1410;
  fVar85 = local_1420;
  fVar86 = local_1420;
  fVar87 = local_1420;
  fVar88 = local_1420;
  fVar89 = local_1430;
  fVar90 = local_1430;
  fVar121 = local_1430;
  fVar122 = local_1430;
  fVar123 = local_1440;
  fVar125 = local_1440;
  fVar126 = local_1440;
  fVar127 = local_1440;
  fVar128 = local_1450;
  fVar130 = local_1450;
  fVar131 = local_1450;
  fVar132 = local_1450;
  fStack_144c = local_1450;
  fStack_1448 = local_1450;
  fStack_1444 = local_1450;
  fStack_143c = local_1440;
  fStack_1438 = local_1440;
  fStack_1434 = local_1440;
  fStack_142c = local_1430;
  fStack_1428 = local_1430;
  fStack_1424 = local_1430;
  fStack_141c = local_1420;
  fStack_1418 = local_1420;
  fStack_1414 = local_1420;
  fStack_140c = local_1410;
  fStack_1408 = local_1410;
  fStack_1404 = local_1410;
  fStack_13fc = local_1400;
  fStack_13f8 = local_1400;
  fStack_13f4 = local_1400;
  do {
    do {
      do {
        if (pauVar43 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar32 = pauVar43 + -1;
        pauVar43 = pauVar43 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar32 + 8));
      uVar46 = *(ulong *)*pauVar43;
      do {
        if ((uVar46 & 8) == 0) {
          auVar52 = vsubps_avx(*(undefined1 (*) [16])(uVar46 + 0x20 + uVar38),auVar96._0_16_);
          auVar51._0_4_ = fVar110 * auVar52._0_4_;
          auVar51._4_4_ = fVar112 * auVar52._4_4_;
          auVar51._8_4_ = fVar113 * auVar52._8_4_;
          auVar51._12_4_ = fVar114 * auVar52._12_4_;
          auVar52 = vsubps_avx(*(undefined1 (*) [16])(uVar46 + 0x20 + uVar41),auVar98._0_16_);
          auVar63._0_4_ = fVar115 * auVar52._0_4_;
          auVar63._4_4_ = fVar118 * auVar52._4_4_;
          auVar63._8_4_ = fVar119 * auVar52._8_4_;
          auVar63._12_4_ = fVar99 * auVar52._12_4_;
          auVar52 = vmaxps_avx(auVar51,auVar63);
          auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar46 + 0x20 + uVar42),auVar103._0_16_);
          auVar64._0_4_ = fVar85 * auVar51._0_4_;
          auVar64._4_4_ = fVar86 * auVar51._4_4_;
          auVar64._8_4_ = fVar87 * auVar51._8_4_;
          auVar64._12_4_ = fVar88 * auVar51._12_4_;
          auVar51 = vmaxps_avx(auVar64,auVar92._0_16_);
          local_1300 = vmaxps_avx(auVar52,auVar51);
          auVar52 = vsubps_avx(*(undefined1 (*) [16])(uVar46 + 0x20 + local_1568),auVar96._0_16_);
          auVar65._0_4_ = fVar89 * auVar52._0_4_;
          auVar65._4_4_ = fVar90 * auVar52._4_4_;
          auVar65._8_4_ = fVar121 * auVar52._8_4_;
          auVar65._12_4_ = fVar122 * auVar52._12_4_;
          auVar52 = vsubps_avx(*(undefined1 (*) [16])(uVar46 + 0x20 + local_1570),auVar98._0_16_);
          auVar69._0_4_ = fVar123 * auVar52._0_4_;
          auVar69._4_4_ = fVar125 * auVar52._4_4_;
          auVar69._8_4_ = fVar126 * auVar52._8_4_;
          auVar69._12_4_ = fVar127 * auVar52._12_4_;
          auVar52 = vminps_avx(auVar65,auVar69);
          auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar46 + 0x20 + local_1578),auVar103._0_16_);
          auVar70._0_4_ = fVar128 * auVar51._0_4_;
          auVar70._4_4_ = fVar130 * auVar51._4_4_;
          auVar70._8_4_ = fVar131 * auVar51._8_4_;
          auVar70._12_4_ = fVar132 * auVar51._12_4_;
          auVar51 = vminps_avx(auVar70,auVar50._0_16_);
          auVar52 = vminps_avx(auVar52,auVar51);
          auVar52 = vcmpps_avx(local_1300,auVar52,2);
          uVar44 = vmovmskps_avx(auVar52);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar44);
        }
        if ((uVar46 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar33 = 4;
          }
          else {
            uVar45 = uVar46 & 0xfffffffffffffff0;
            lVar40 = 0;
            for (uVar46 = unaff_R12; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
              lVar40 = lVar40 + 1;
            }
            iVar33 = 0;
            uVar39 = unaff_R12 - 1 & unaff_R12;
            uVar46 = *(ulong *)(uVar45 + lVar40 * 8);
            if (uVar39 != 0) {
              uVar35 = *(uint *)(local_1300 + lVar40 * 4);
              lVar40 = 0;
              for (uVar12 = uVar39; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
                lVar40 = lVar40 + 1;
              }
              uVar39 = uVar39 - 1 & uVar39;
              uVar12 = *(ulong *)(uVar45 + lVar40 * 8);
              uVar34 = *(uint *)(local_1300 + lVar40 * 4);
              if (uVar39 == 0) {
                if (uVar35 < uVar34) {
                  *(ulong *)*pauVar43 = uVar12;
                  *(uint *)(*pauVar43 + 8) = uVar34;
                  pauVar43 = pauVar43 + 1;
                }
                else {
                  *(ulong *)*pauVar43 = uVar46;
                  *(uint *)(*pauVar43 + 8) = uVar35;
                  pauVar43 = pauVar43 + 1;
                  uVar46 = uVar12;
                }
              }
              else {
                auVar52._8_8_ = 0;
                auVar52._0_8_ = uVar46;
                auVar52 = vpunpcklqdq_avx(auVar52,ZEXT416(uVar35));
                auVar66._8_8_ = 0;
                auVar66._0_8_ = uVar12;
                auVar51 = vpunpcklqdq_avx(auVar66,ZEXT416(uVar34));
                lVar40 = 0;
                for (uVar46 = uVar39; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000)
                {
                  lVar40 = lVar40 + 1;
                }
                uVar39 = uVar39 - 1 & uVar39;
                auVar71._8_8_ = 0;
                auVar71._0_8_ = *(ulong *)(uVar45 + lVar40 * 8);
                auVar64 = vpunpcklqdq_avx(auVar71,ZEXT416(*(uint *)(local_1300 + lVar40 * 4)));
                auVar63 = vpcmpgtd_avx(auVar51,auVar52);
                if (uVar39 == 0) {
                  auVar65 = vpshufd_avx(auVar63,0xaa);
                  auVar63 = vblendvps_avx(auVar51,auVar52,auVar65);
                  auVar52 = vblendvps_avx(auVar52,auVar51,auVar65);
                  auVar51 = vpcmpgtd_avx(auVar64,auVar63);
                  auVar65 = vpshufd_avx(auVar51,0xaa);
                  auVar51 = vblendvps_avx(auVar64,auVar63,auVar65);
                  auVar63 = vblendvps_avx(auVar63,auVar64,auVar65);
                  auVar64 = vpcmpgtd_avx(auVar63,auVar52);
                  auVar65 = vpshufd_avx(auVar64,0xaa);
                  auVar64 = vblendvps_avx(auVar63,auVar52,auVar65);
                  auVar52 = vblendvps_avx(auVar52,auVar63,auVar65);
                  *pauVar43 = auVar52;
                  pauVar43[1] = auVar64;
                  uVar46 = auVar51._0_8_;
                  pauVar43 = pauVar43 + 2;
                }
                else {
                  lVar40 = 0;
                  for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
                    lVar40 = lVar40 + 1;
                  }
                  auVar82._8_8_ = 0;
                  auVar82._0_8_ = *(ulong *)(uVar45 + lVar40 * 8);
                  auVar69 = vpunpcklqdq_avx(auVar82,ZEXT416(*(uint *)(local_1300 + lVar40 * 4)));
                  auVar65 = vpshufd_avx(auVar63,0xaa);
                  auVar63 = vblendvps_avx(auVar51,auVar52,auVar65);
                  auVar52 = vblendvps_avx(auVar52,auVar51,auVar65);
                  auVar51 = vpcmpgtd_avx(auVar69,auVar64);
                  auVar65 = vpshufd_avx(auVar51,0xaa);
                  auVar51 = vblendvps_avx(auVar69,auVar64,auVar65);
                  auVar64 = vblendvps_avx(auVar64,auVar69,auVar65);
                  auVar65 = vpcmpgtd_avx(auVar64,auVar52);
                  auVar69 = vpshufd_avx(auVar65,0xaa);
                  auVar65 = vblendvps_avx(auVar64,auVar52,auVar69);
                  auVar52 = vblendvps_avx(auVar52,auVar64,auVar69);
                  auVar64 = vpcmpgtd_avx(auVar51,auVar63);
                  auVar69 = vpshufd_avx(auVar64,0xaa);
                  auVar64 = vblendvps_avx(auVar51,auVar63,auVar69);
                  auVar51 = vblendvps_avx(auVar63,auVar51,auVar69);
                  auVar63 = vpcmpgtd_avx(auVar65,auVar51);
                  auVar69 = vpshufd_avx(auVar63,0xaa);
                  auVar63 = vblendvps_avx(auVar65,auVar51,auVar69);
                  auVar51 = vblendvps_avx(auVar51,auVar65,auVar69);
                  *pauVar43 = auVar52;
                  pauVar43[1] = auVar51;
                  pauVar43[2] = auVar63;
                  auVar92 = ZEXT1664(local_14d0);
                  uVar46 = auVar64._0_8_;
                  pauVar43 = pauVar43 + 3;
                }
              }
            }
          }
        }
        else {
          iVar33 = 6;
        }
      } while (iVar33 == 0);
    } while (iVar33 != 6);
    uVar45 = (ulong)((uint)uVar46 & 0xf);
    if (uVar45 != 8) {
      uVar46 = uVar46 & 0xfffffffffffffff0;
      lVar40 = 0;
      do {
        lVar36 = lVar40 * 0xe0;
        lVar1 = uVar46 + 0xd0 + lVar36;
        local_13c0 = *(undefined8 *)(lVar1 + 0x10);
        uStack_13b8 = *(undefined8 *)(lVar1 + 0x18);
        lVar1 = uVar46 + 0xc0 + lVar36;
        local_fc0 = *(undefined8 *)(lVar1 + 0x10);
        uStack_fb8 = *(undefined8 *)(lVar1 + 0x18);
        uStack_fb0 = local_fc0;
        uStack_fa8 = uStack_fb8;
        uStack_13b0 = local_13c0;
        uStack_13a8 = uStack_13b8;
        auVar74._16_16_ = *(undefined1 (*) [16])(uVar46 + 0x60 + lVar36);
        auVar74._0_16_ = *(undefined1 (*) [16])(uVar46 + lVar36);
        auVar56._16_16_ = *(undefined1 (*) [16])(uVar46 + 0x70 + lVar36);
        auVar56._0_16_ = *(undefined1 (*) [16])(uVar46 + 0x10 + lVar36);
        auVar67._16_16_ = *(undefined1 (*) [16])(uVar46 + 0x80 + lVar36);
        auVar67._0_16_ = *(undefined1 (*) [16])(uVar46 + 0x20 + lVar36);
        auVar52 = *(undefined1 (*) [16])(uVar46 + 0x30 + lVar36);
        auVar91._16_16_ = auVar52;
        auVar91._0_16_ = auVar52;
        auVar52 = *(undefined1 (*) [16])(uVar46 + 0x40 + lVar36);
        auVar77._16_16_ = auVar52;
        auVar77._0_16_ = auVar52;
        auVar52 = *(undefined1 (*) [16])(uVar46 + 0x50 + lVar36);
        auVar83._16_16_ = auVar52;
        auVar83._0_16_ = auVar52;
        auVar52 = *(undefined1 (*) [16])(uVar46 + 0x90 + lVar36);
        auVar93._16_16_ = auVar52;
        auVar93._0_16_ = auVar52;
        auVar52 = *(undefined1 (*) [16])(uVar46 + 0xa0 + lVar36);
        auVar129._16_16_ = auVar52;
        auVar129._0_16_ = auVar52;
        auVar52 = *(undefined1 (*) [16])(uVar46 + 0xb0 + lVar36);
        auVar47._16_16_ = auVar52;
        auVar47._0_16_ = auVar52;
        uVar44 = *(undefined4 *)(ray + k * 4);
        auVar116._4_4_ = uVar44;
        auVar116._0_4_ = uVar44;
        auVar116._8_4_ = uVar44;
        auVar116._12_4_ = uVar44;
        auVar116._16_4_ = uVar44;
        auVar116._20_4_ = uVar44;
        auVar116._24_4_ = uVar44;
        auVar116._28_4_ = uVar44;
        uVar44 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar120._4_4_ = uVar44;
        auVar120._0_4_ = uVar44;
        auVar120._8_4_ = uVar44;
        auVar120._12_4_ = uVar44;
        auVar120._16_4_ = uVar44;
        auVar120._20_4_ = uVar44;
        auVar120._24_4_ = uVar44;
        auVar120._28_4_ = uVar44;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar124._4_4_ = uVar2;
        auVar124._0_4_ = uVar2;
        auVar124._8_4_ = uVar2;
        auVar124._12_4_ = uVar2;
        auVar124._16_4_ = uVar2;
        auVar124._20_4_ = uVar2;
        auVar124._24_4_ = uVar2;
        auVar124._28_4_ = uVar2;
        auVar74 = vsubps_avx(auVar74,auVar116);
        local_1480 = vsubps_avx(auVar56,auVar120);
        local_14a0 = vsubps_avx(auVar67,auVar124);
        auVar55 = vsubps_avx(auVar91,auVar116);
        auVar73 = vsubps_avx(auVar77,auVar120);
        auVar61 = vsubps_avx(auVar83,auVar124);
        auVar56 = vsubps_avx(auVar93,auVar116);
        auVar67 = vsubps_avx(auVar129,auVar120);
        auVar10 = vsubps_avx(auVar47,auVar124);
        local_fe0 = vsubps_avx(auVar56,auVar74);
        local_1020 = vsubps_avx(auVar67,local_1480);
        local_1000 = vsubps_avx(auVar10,local_14a0);
        auVar48._0_4_ = auVar74._0_4_ + auVar56._0_4_;
        auVar48._4_4_ = auVar74._4_4_ + auVar56._4_4_;
        auVar48._8_4_ = auVar74._8_4_ + auVar56._8_4_;
        auVar48._12_4_ = auVar74._12_4_ + auVar56._12_4_;
        auVar48._16_4_ = auVar74._16_4_ + auVar56._16_4_;
        auVar48._20_4_ = auVar74._20_4_ + auVar56._20_4_;
        auVar48._24_4_ = auVar74._24_4_ + auVar56._24_4_;
        auVar48._28_4_ = auVar74._28_4_ + auVar56._28_4_;
        auVar94._0_4_ = auVar67._0_4_ + local_1480._0_4_;
        auVar94._4_4_ = auVar67._4_4_ + local_1480._4_4_;
        auVar94._8_4_ = auVar67._8_4_ + local_1480._8_4_;
        auVar94._12_4_ = auVar67._12_4_ + local_1480._12_4_;
        auVar94._16_4_ = auVar67._16_4_ + local_1480._16_4_;
        auVar94._20_4_ = auVar67._20_4_ + local_1480._20_4_;
        auVar94._24_4_ = auVar67._24_4_ + local_1480._24_4_;
        auVar94._28_4_ = auVar67._28_4_ + local_1480._28_4_;
        fVar110 = local_14a0._0_4_;
        auVar78._0_4_ = auVar10._0_4_ + fVar110;
        fVar112 = local_14a0._4_4_;
        auVar78._4_4_ = auVar10._4_4_ + fVar112;
        fVar113 = local_14a0._8_4_;
        auVar78._8_4_ = auVar10._8_4_ + fVar113;
        fVar114 = local_14a0._12_4_;
        auVar78._12_4_ = auVar10._12_4_ + fVar114;
        fVar115 = local_14a0._16_4_;
        auVar78._16_4_ = auVar10._16_4_ + fVar115;
        fVar118 = local_14a0._20_4_;
        auVar78._20_4_ = auVar10._20_4_ + fVar118;
        fVar119 = local_14a0._24_4_;
        auVar78._24_4_ = auVar10._24_4_ + fVar119;
        fVar104 = auVar10._28_4_;
        auVar78._28_4_ = fVar104 + local_14a0._28_4_;
        auVar11._4_4_ = local_1000._4_4_ * auVar94._4_4_;
        auVar11._0_4_ = local_1000._0_4_ * auVar94._0_4_;
        auVar11._8_4_ = local_1000._8_4_ * auVar94._8_4_;
        auVar11._12_4_ = local_1000._12_4_ * auVar94._12_4_;
        auVar11._16_4_ = local_1000._16_4_ * auVar94._16_4_;
        auVar11._20_4_ = local_1000._20_4_ * auVar94._20_4_;
        auVar11._24_4_ = local_1000._24_4_ * auVar94._24_4_;
        auVar11._28_4_ = uVar44;
        auVar51 = vfmsub231ps_fma(auVar11,local_1020,auVar78);
        auVar13._4_4_ = local_fe0._4_4_ * auVar78._4_4_;
        auVar13._0_4_ = local_fe0._0_4_ * auVar78._0_4_;
        auVar13._8_4_ = local_fe0._8_4_ * auVar78._8_4_;
        auVar13._12_4_ = local_fe0._12_4_ * auVar78._12_4_;
        auVar13._16_4_ = local_fe0._16_4_ * auVar78._16_4_;
        auVar13._20_4_ = local_fe0._20_4_ * auVar78._20_4_;
        auVar13._24_4_ = local_fe0._24_4_ * auVar78._24_4_;
        auVar13._28_4_ = auVar78._28_4_;
        auVar52 = vfmsub231ps_fma(auVar13,local_1000,auVar48);
        auVar14._4_4_ = local_1020._4_4_ * auVar48._4_4_;
        auVar14._0_4_ = local_1020._0_4_ * auVar48._0_4_;
        auVar14._8_4_ = local_1020._8_4_ * auVar48._8_4_;
        auVar14._12_4_ = local_1020._12_4_ * auVar48._12_4_;
        auVar14._16_4_ = local_1020._16_4_ * auVar48._16_4_;
        auVar14._20_4_ = local_1020._20_4_ * auVar48._20_4_;
        auVar14._24_4_ = local_1020._24_4_ * auVar48._24_4_;
        auVar14._28_4_ = auVar48._28_4_;
        auVar63 = vfmsub231ps_fma(auVar14,local_fe0,auVar94);
        uVar44 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar117._4_4_ = uVar44;
        auVar117._0_4_ = uVar44;
        auVar117._8_4_ = uVar44;
        auVar117._12_4_ = uVar44;
        auVar117._16_4_ = uVar44;
        auVar117._20_4_ = uVar44;
        auVar117._24_4_ = uVar44;
        auVar117._28_4_ = uVar44;
        local_1060 = *(float *)(ray + k * 4 + 0x60);
        auVar15._4_4_ = local_1060 * auVar63._4_4_;
        auVar15._0_4_ = local_1060 * auVar63._0_4_;
        auVar15._8_4_ = local_1060 * auVar63._8_4_;
        auVar15._12_4_ = local_1060 * auVar63._12_4_;
        auVar15._16_4_ = local_1060 * 0.0;
        auVar15._20_4_ = local_1060 * 0.0;
        auVar15._24_4_ = local_1060 * 0.0;
        auVar15._28_4_ = fVar104;
        auVar52 = vfmadd231ps_fma(auVar15,auVar117,ZEXT1632(auVar52));
        uVar44 = *(undefined4 *)(ray + k * 4 + 0x40);
        local_1040._4_4_ = uVar44;
        local_1040._0_4_ = uVar44;
        local_1040._8_4_ = uVar44;
        local_1040._12_4_ = uVar44;
        local_1040._16_4_ = uVar44;
        local_1040._20_4_ = uVar44;
        local_1040._24_4_ = uVar44;
        local_1040._28_4_ = uVar44;
        local_1300 = vfmadd231ps_fma(ZEXT1632(auVar52),local_1040,ZEXT1632(auVar51));
        local_1080 = vsubps_avx(local_1480,auVar73);
        local_10a0 = vsubps_avx(local_14a0,auVar61);
        auVar57._0_4_ = auVar73._0_4_ + local_1480._0_4_;
        auVar57._4_4_ = auVar73._4_4_ + local_1480._4_4_;
        auVar57._8_4_ = auVar73._8_4_ + local_1480._8_4_;
        auVar57._12_4_ = auVar73._12_4_ + local_1480._12_4_;
        auVar57._16_4_ = auVar73._16_4_ + local_1480._16_4_;
        auVar57._20_4_ = auVar73._20_4_ + local_1480._20_4_;
        auVar57._24_4_ = auVar73._24_4_ + local_1480._24_4_;
        auVar57._28_4_ = auVar73._28_4_ + local_1480._28_4_;
        auVar79._0_4_ = fVar110 + auVar61._0_4_;
        auVar79._4_4_ = fVar112 + auVar61._4_4_;
        auVar79._8_4_ = fVar113 + auVar61._8_4_;
        auVar79._12_4_ = fVar114 + auVar61._12_4_;
        auVar79._16_4_ = fVar115 + auVar61._16_4_;
        auVar79._20_4_ = fVar118 + auVar61._20_4_;
        auVar79._24_4_ = fVar119 + auVar61._24_4_;
        fVar99 = auVar61._28_4_;
        auVar79._28_4_ = local_14a0._28_4_ + fVar99;
        fVar85 = local_10a0._0_4_;
        fVar88 = local_10a0._4_4_;
        auVar16._4_4_ = auVar57._4_4_ * fVar88;
        auVar16._0_4_ = auVar57._0_4_ * fVar85;
        fVar121 = local_10a0._8_4_;
        auVar16._8_4_ = auVar57._8_4_ * fVar121;
        fVar125 = local_10a0._12_4_;
        auVar16._12_4_ = auVar57._12_4_ * fVar125;
        fVar128 = local_10a0._16_4_;
        auVar16._16_4_ = auVar57._16_4_ * fVar128;
        fVar132 = local_10a0._20_4_;
        auVar16._20_4_ = auVar57._20_4_ * fVar132;
        fVar7 = local_10a0._24_4_;
        auVar16._24_4_ = auVar57._24_4_ * fVar7;
        auVar16._28_4_ = auVar94._28_4_;
        auVar51 = vfmsub231ps_fma(auVar16,local_1080,auVar79);
        local_10c0 = vsubps_avx(auVar74,auVar55);
        fVar86 = local_10c0._0_4_;
        fVar89 = local_10c0._4_4_;
        auVar17._4_4_ = auVar79._4_4_ * fVar89;
        auVar17._0_4_ = auVar79._0_4_ * fVar86;
        fVar122 = local_10c0._8_4_;
        auVar17._8_4_ = auVar79._8_4_ * fVar122;
        fVar126 = local_10c0._12_4_;
        auVar17._12_4_ = auVar79._12_4_ * fVar126;
        fVar130 = local_10c0._16_4_;
        auVar17._16_4_ = auVar79._16_4_ * fVar130;
        fVar5 = local_10c0._20_4_;
        auVar17._20_4_ = auVar79._20_4_ * fVar5;
        fVar8 = local_10c0._24_4_;
        auVar17._24_4_ = auVar79._24_4_ * fVar8;
        auVar17._28_4_ = auVar79._28_4_;
        auVar100._0_4_ = auVar74._0_4_ + auVar55._0_4_;
        auVar100._4_4_ = auVar74._4_4_ + auVar55._4_4_;
        auVar100._8_4_ = auVar74._8_4_ + auVar55._8_4_;
        auVar100._12_4_ = auVar74._12_4_ + auVar55._12_4_;
        auVar100._16_4_ = auVar74._16_4_ + auVar55._16_4_;
        auVar100._20_4_ = auVar74._20_4_ + auVar55._20_4_;
        auVar100._24_4_ = auVar74._24_4_ + auVar55._24_4_;
        auVar100._28_4_ = auVar74._28_4_ + auVar55._28_4_;
        auVar52 = vfmsub231ps_fma(auVar17,local_10a0,auVar100);
        fVar87 = local_1080._0_4_;
        fVar90 = local_1080._4_4_;
        auVar18._4_4_ = auVar100._4_4_ * fVar90;
        auVar18._0_4_ = auVar100._0_4_ * fVar87;
        fVar123 = local_1080._8_4_;
        auVar18._8_4_ = auVar100._8_4_ * fVar123;
        fVar127 = local_1080._12_4_;
        auVar18._12_4_ = auVar100._12_4_ * fVar127;
        fVar131 = local_1080._16_4_;
        auVar18._16_4_ = auVar100._16_4_ * fVar131;
        fVar6 = local_1080._20_4_;
        auVar18._20_4_ = auVar100._20_4_ * fVar6;
        fVar9 = local_1080._24_4_;
        auVar18._24_4_ = auVar100._24_4_ * fVar9;
        auVar18._28_4_ = auVar100._28_4_;
        auVar63 = vfmsub231ps_fma(auVar18,local_10c0,auVar57);
        auVar101._0_4_ = auVar63._0_4_ * local_1060;
        auVar101._4_4_ = auVar63._4_4_ * local_1060;
        auVar101._8_4_ = auVar63._8_4_ * local_1060;
        auVar101._12_4_ = auVar63._12_4_ * local_1060;
        auVar101._16_4_ = local_1060 * 0.0;
        auVar101._20_4_ = local_1060 * 0.0;
        auVar101._24_4_ = local_1060 * 0.0;
        auVar101._28_4_ = 0;
        auVar52 = vfmadd231ps_fma(auVar101,auVar117,ZEXT1632(auVar52));
        auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),local_1040,ZEXT1632(auVar51));
        auVar11 = vsubps_avx(auVar55,auVar56);
        auVar75._0_4_ = auVar55._0_4_ + auVar56._0_4_;
        auVar75._4_4_ = auVar55._4_4_ + auVar56._4_4_;
        auVar75._8_4_ = auVar55._8_4_ + auVar56._8_4_;
        auVar75._12_4_ = auVar55._12_4_ + auVar56._12_4_;
        auVar75._16_4_ = auVar55._16_4_ + auVar56._16_4_;
        auVar75._20_4_ = auVar55._20_4_ + auVar56._20_4_;
        auVar75._24_4_ = auVar55._24_4_ + auVar56._24_4_;
        auVar75._28_4_ = auVar55._28_4_ + auVar56._28_4_;
        auVar56 = vsubps_avx(auVar73,auVar67);
        auVar84._0_4_ = auVar73._0_4_ + auVar67._0_4_;
        auVar84._4_4_ = auVar73._4_4_ + auVar67._4_4_;
        auVar84._8_4_ = auVar73._8_4_ + auVar67._8_4_;
        auVar84._12_4_ = auVar73._12_4_ + auVar67._12_4_;
        auVar84._16_4_ = auVar73._16_4_ + auVar67._16_4_;
        auVar84._20_4_ = auVar73._20_4_ + auVar67._20_4_;
        auVar84._24_4_ = auVar73._24_4_ + auVar67._24_4_;
        auVar84._28_4_ = auVar73._28_4_ + auVar67._28_4_;
        auVar67 = vsubps_avx(auVar61,auVar10);
        auVar58._0_4_ = auVar61._0_4_ + auVar10._0_4_;
        auVar58._4_4_ = auVar61._4_4_ + auVar10._4_4_;
        auVar58._8_4_ = auVar61._8_4_ + auVar10._8_4_;
        auVar58._12_4_ = auVar61._12_4_ + auVar10._12_4_;
        auVar58._16_4_ = auVar61._16_4_ + auVar10._16_4_;
        auVar58._20_4_ = auVar61._20_4_ + auVar10._20_4_;
        auVar58._24_4_ = auVar61._24_4_ + auVar10._24_4_;
        auVar58._28_4_ = fVar99 + fVar104;
        auVar61._4_4_ = auVar67._4_4_ * auVar84._4_4_;
        auVar61._0_4_ = auVar67._0_4_ * auVar84._0_4_;
        auVar61._8_4_ = auVar67._8_4_ * auVar84._8_4_;
        auVar61._12_4_ = auVar67._12_4_ * auVar84._12_4_;
        auVar61._16_4_ = auVar67._16_4_ * auVar84._16_4_;
        auVar61._20_4_ = auVar67._20_4_ * auVar84._20_4_;
        auVar61._24_4_ = auVar67._24_4_ * auVar84._24_4_;
        auVar61._28_4_ = fVar99;
        auVar63 = vfmsub231ps_fma(auVar61,auVar56,auVar58);
        auVar10._4_4_ = auVar58._4_4_ * auVar11._4_4_;
        auVar10._0_4_ = auVar58._0_4_ * auVar11._0_4_;
        auVar10._8_4_ = auVar58._8_4_ * auVar11._8_4_;
        auVar10._12_4_ = auVar58._12_4_ * auVar11._12_4_;
        auVar10._16_4_ = auVar58._16_4_ * auVar11._16_4_;
        auVar10._20_4_ = auVar58._20_4_ * auVar11._20_4_;
        auVar10._24_4_ = auVar58._24_4_ * auVar11._24_4_;
        auVar10._28_4_ = auVar58._28_4_;
        auVar51 = vfmsub231ps_fma(auVar10,auVar67,auVar75);
        auVar19._4_4_ = auVar56._4_4_ * auVar75._4_4_;
        auVar19._0_4_ = auVar56._0_4_ * auVar75._0_4_;
        auVar19._8_4_ = auVar56._8_4_ * auVar75._8_4_;
        auVar19._12_4_ = auVar56._12_4_ * auVar75._12_4_;
        auVar19._16_4_ = auVar56._16_4_ * auVar75._16_4_;
        auVar19._20_4_ = auVar56._20_4_ * auVar75._20_4_;
        auVar19._24_4_ = auVar56._24_4_ * auVar75._24_4_;
        auVar19._28_4_ = auVar75._28_4_;
        auVar64 = vfmsub231ps_fma(auVar19,auVar11,auVar84);
        fStack_105c = local_1060;
        fStack_1058 = local_1060;
        fStack_1054 = local_1060;
        fStack_1050 = local_1060;
        fStack_104c = local_1060;
        fStack_1048 = local_1060;
        fStack_1044 = local_1060;
        auVar76._0_4_ = local_1060 * auVar64._0_4_;
        auVar76._4_4_ = local_1060 * auVar64._4_4_;
        auVar76._8_4_ = local_1060 * auVar64._8_4_;
        auVar76._12_4_ = local_1060 * auVar64._12_4_;
        auVar76._16_4_ = local_1060 * 0.0;
        auVar76._20_4_ = local_1060 * 0.0;
        auVar76._24_4_ = local_1060 * 0.0;
        auVar76._28_4_ = 0;
        auVar51 = vfmadd231ps_fma(auVar76,auVar117,ZEXT1632(auVar51));
        auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),local_1040,ZEXT1632(auVar63));
        local_12e0 = ZEXT1632(auVar52);
        local_12c0 = ZEXT1632(CONCAT412(auVar51._12_4_ + auVar52._12_4_ + local_1300._12_4_,
                                        CONCAT48(auVar51._8_4_ + auVar52._8_4_ + local_1300._8_4_,
                                                 CONCAT44(auVar51._4_4_ +
                                                          auVar52._4_4_ + local_1300._4_4_,
                                                          auVar51._0_4_ +
                                                          auVar52._0_4_ + local_1300._0_4_))));
        auVar59._8_4_ = 0x7fffffff;
        auVar59._0_8_ = 0x7fffffff7fffffff;
        auVar59._12_4_ = 0x7fffffff;
        auVar59._16_4_ = 0x7fffffff;
        auVar59._20_4_ = 0x7fffffff;
        auVar59._24_4_ = 0x7fffffff;
        auVar59._28_4_ = 0x7fffffff;
        auVar55 = vminps_avx(ZEXT1632(local_1300),local_12e0);
        auVar55 = vminps_avx(auVar55,ZEXT1632(auVar51));
        local_1100 = vandps_avx(local_12c0,auVar59);
        fVar99 = local_1100._0_4_ * 1.1920929e-07;
        fVar104 = local_1100._4_4_ * 1.1920929e-07;
        auVar20._4_4_ = fVar104;
        auVar20._0_4_ = fVar99;
        fVar105 = local_1100._8_4_ * 1.1920929e-07;
        auVar20._8_4_ = fVar105;
        fVar106 = local_1100._12_4_ * 1.1920929e-07;
        auVar20._12_4_ = fVar106;
        fVar107 = local_1100._16_4_ * 1.1920929e-07;
        auVar20._16_4_ = fVar107;
        fVar108 = local_1100._20_4_ * 1.1920929e-07;
        auVar20._20_4_ = fVar108;
        fVar109 = local_1100._24_4_ * 1.1920929e-07;
        auVar20._24_4_ = fVar109;
        auVar20._28_4_ = 0x34000000;
        auVar95._0_8_ = CONCAT44(fVar104,fVar99) ^ 0x8000000080000000;
        auVar95._8_4_ = -fVar105;
        auVar95._12_4_ = -fVar106;
        auVar95._16_4_ = -fVar107;
        auVar95._20_4_ = -fVar108;
        auVar95._24_4_ = -fVar109;
        auVar95._28_4_ = 0xb4000000;
        auVar55 = vcmpps_avx(auVar55,auVar95,5);
        local_10e0 = ZEXT1632(local_1300);
        auVar61 = vmaxps_avx(ZEXT1632(local_1300),local_12e0);
        auVar73 = vmaxps_avx(auVar61,ZEXT1632(auVar51));
        auVar73 = vcmpps_avx(auVar73,auVar20,2);
        auVar73 = vorps_avx(auVar55,auVar73);
        if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar73 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar73 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar73 >> 0x7f,0) != '\0') ||
              (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar73 >> 0xbf,0) != '\0') ||
            (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar73[0x1f] < '\0') {
          auVar21._4_4_ = fVar90 * local_1000._4_4_;
          auVar21._0_4_ = fVar87 * local_1000._0_4_;
          auVar21._8_4_ = fVar123 * local_1000._8_4_;
          auVar21._12_4_ = fVar127 * local_1000._12_4_;
          auVar21._16_4_ = fVar131 * local_1000._16_4_;
          auVar21._20_4_ = fVar6 * local_1000._20_4_;
          auVar21._24_4_ = fVar9 * local_1000._24_4_;
          auVar21._28_4_ = auVar55._28_4_;
          auVar22._4_4_ = fVar89 * local_1020._4_4_;
          auVar22._0_4_ = fVar86 * local_1020._0_4_;
          auVar22._8_4_ = fVar122 * local_1020._8_4_;
          auVar22._12_4_ = fVar126 * local_1020._12_4_;
          auVar22._16_4_ = fVar130 * local_1020._16_4_;
          auVar22._20_4_ = fVar5 * local_1020._20_4_;
          auVar22._24_4_ = fVar8 * local_1020._24_4_;
          auVar22._28_4_ = 0x34000000;
          auVar51 = vfmsub213ps_fma(local_1020,local_10a0,auVar21);
          auVar23._4_4_ = auVar56._4_4_ * fVar88;
          auVar23._0_4_ = auVar56._0_4_ * fVar85;
          auVar23._8_4_ = auVar56._8_4_ * fVar121;
          auVar23._12_4_ = auVar56._12_4_ * fVar125;
          auVar23._16_4_ = auVar56._16_4_ * fVar128;
          auVar23._20_4_ = auVar56._20_4_ * fVar132;
          auVar23._24_4_ = auVar56._24_4_ * fVar7;
          auVar23._28_4_ = auVar61._28_4_;
          auVar24._4_4_ = fVar89 * auVar67._4_4_;
          auVar24._0_4_ = fVar86 * auVar67._0_4_;
          auVar24._8_4_ = fVar122 * auVar67._8_4_;
          auVar24._12_4_ = fVar126 * auVar67._12_4_;
          auVar24._16_4_ = fVar130 * auVar67._16_4_;
          auVar24._20_4_ = fVar5 * auVar67._20_4_;
          auVar24._24_4_ = fVar8 * auVar67._24_4_;
          auVar24._28_4_ = local_1100._28_4_;
          auVar63 = vfmsub213ps_fma(auVar67,local_1080,auVar23);
          auVar55 = vandps_avx(auVar21,auVar59);
          auVar61 = vandps_avx(auVar23,auVar59);
          auVar55 = vcmpps_avx(auVar55,auVar61,1);
          local_12a0 = vblendvps_avx(ZEXT1632(auVar63),ZEXT1632(auVar51),auVar55);
          auVar25._4_4_ = fVar90 * auVar11._4_4_;
          auVar25._0_4_ = fVar87 * auVar11._0_4_;
          auVar25._8_4_ = fVar123 * auVar11._8_4_;
          auVar25._12_4_ = fVar127 * auVar11._12_4_;
          auVar25._16_4_ = fVar131 * auVar11._16_4_;
          auVar25._20_4_ = fVar6 * auVar11._20_4_;
          auVar25._24_4_ = fVar9 * auVar11._24_4_;
          auVar25._28_4_ = auVar55._28_4_;
          auVar51 = vfmsub213ps_fma(auVar11,local_10a0,auVar24);
          auVar26._4_4_ = local_fe0._4_4_ * fVar88;
          auVar26._0_4_ = local_fe0._0_4_ * fVar85;
          auVar26._8_4_ = local_fe0._8_4_ * fVar121;
          auVar26._12_4_ = local_fe0._12_4_ * fVar125;
          auVar26._16_4_ = local_fe0._16_4_ * fVar128;
          auVar26._20_4_ = local_fe0._20_4_ * fVar132;
          auVar26._24_4_ = local_fe0._24_4_ * fVar7;
          auVar26._28_4_ = auVar61._28_4_;
          auVar63 = vfmsub213ps_fma(local_1000,local_10c0,auVar26);
          auVar55 = vandps_avx(auVar26,auVar59);
          auVar61 = vandps_avx(auVar24,auVar59);
          auVar55 = vcmpps_avx(auVar55,auVar61,1);
          local_1280 = vblendvps_avx(ZEXT1632(auVar51),ZEXT1632(auVar63),auVar55);
          auVar51 = vfmsub213ps_fma(local_fe0,local_1080,auVar22);
          auVar63 = vfmsub213ps_fma(auVar56,local_10c0,auVar25);
          auVar55 = vandps_avx(auVar22,auVar59);
          auVar61 = vandps_avx(auVar25,auVar59);
          auVar61 = vcmpps_avx(auVar55,auVar61,1);
          local_1260 = vblendvps_avx(ZEXT1632(auVar63),ZEXT1632(auVar51),auVar61);
          auVar51 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
          fVar99 = local_1260._0_4_;
          auVar60._0_4_ = fVar99 * local_1060;
          fVar85 = local_1260._4_4_;
          auVar60._4_4_ = fVar85 * local_1060;
          fVar86 = local_1260._8_4_;
          auVar60._8_4_ = fVar86 * local_1060;
          fVar87 = local_1260._12_4_;
          auVar60._12_4_ = fVar87 * local_1060;
          fVar88 = local_1260._16_4_;
          auVar60._16_4_ = fVar88 * local_1060;
          fVar89 = local_1260._20_4_;
          auVar60._20_4_ = fVar89 * local_1060;
          fVar90 = local_1260._24_4_;
          auVar60._24_4_ = fVar90 * local_1060;
          auVar60._28_4_ = 0;
          auVar63 = vfmadd213ps_fma(auVar117,local_1280,auVar60);
          auVar63 = vfmadd213ps_fma(local_1040,local_12a0,ZEXT1632(auVar63));
          auVar61 = ZEXT1632(CONCAT412(auVar63._12_4_ + auVar63._12_4_,
                                       CONCAT48(auVar63._8_4_ + auVar63._8_4_,
                                                CONCAT44(auVar63._4_4_ + auVar63._4_4_,
                                                         auVar63._0_4_ + auVar63._0_4_))));
          auVar27._4_4_ = fVar85 * fVar112;
          auVar27._0_4_ = fVar99 * fVar110;
          auVar27._8_4_ = fVar86 * fVar113;
          auVar27._12_4_ = fVar87 * fVar114;
          auVar27._16_4_ = fVar88 * fVar115;
          auVar27._20_4_ = fVar89 * fVar118;
          auVar27._24_4_ = fVar90 * fVar119;
          auVar27._28_4_ = auVar55._28_4_;
          auVar63 = vfmadd213ps_fma(local_1480,local_1280,auVar27);
          auVar64 = vfmadd213ps_fma(auVar74,local_12a0,ZEXT1632(auVar63));
          auVar55 = vrcpps_avx(auVar61);
          auVar111._8_4_ = 0x3f800000;
          auVar111._0_8_ = &DAT_3f8000003f800000;
          auVar111._12_4_ = 0x3f800000;
          auVar111._16_4_ = 0x3f800000;
          auVar111._20_4_ = 0x3f800000;
          auVar111._24_4_ = 0x3f800000;
          auVar111._28_4_ = 0x3f800000;
          auVar63 = vfnmadd213ps_fma(auVar55,auVar61,auVar111);
          auVar63 = vfmadd132ps_fma(ZEXT1632(auVar63),auVar55,auVar55);
          local_11e0._28_4_ = 0x3f800000;
          local_11e0._0_28_ =
               ZEXT1628(CONCAT412(auVar63._12_4_ * (auVar64._12_4_ + auVar64._12_4_),
                                  CONCAT48(auVar63._8_4_ * (auVar64._8_4_ + auVar64._8_4_),
                                           CONCAT44(auVar63._4_4_ * (auVar64._4_4_ + auVar64._4_4_),
                                                    auVar63._0_4_ * (auVar64._0_4_ + auVar64._0_4_))
                                          )));
          auVar50 = ZEXT3264(local_11e0);
          uVar44 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar80._4_4_ = uVar44;
          auVar80._0_4_ = uVar44;
          auVar80._8_4_ = uVar44;
          auVar80._12_4_ = uVar44;
          auVar80._16_4_ = uVar44;
          auVar80._20_4_ = uVar44;
          auVar80._24_4_ = uVar44;
          auVar80._28_4_ = uVar44;
          uVar44 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar97._4_4_ = uVar44;
          auVar97._0_4_ = uVar44;
          auVar97._8_4_ = uVar44;
          auVar97._12_4_ = uVar44;
          auVar97._16_4_ = uVar44;
          auVar97._20_4_ = uVar44;
          auVar97._24_4_ = uVar44;
          auVar97._28_4_ = uVar44;
          auVar55 = vcmpps_avx(auVar80,local_11e0,2);
          auVar73 = vcmpps_avx(local_11e0,auVar97,2);
          auVar55 = vandps_avx(auVar73,auVar55);
          auVar63 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
          auVar51 = vpand_avx(auVar63,auVar51);
          auVar55 = vpmovsxwd_avx2(auVar51);
          if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar55 >> 0x7f,0) != '\0') ||
                (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar55 >> 0xbf,0) != '\0') ||
              (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar55[0x1f] < '\0') {
            auVar55 = vcmpps_avx(auVar61,_DAT_02020f00,4);
            auVar63 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
            auVar51 = vpand_avx(auVar51,auVar63);
            local_1500 = vpmovsxwd_avx2(auVar51);
            if ((((((((local_1500 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_1500 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_1500 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_1500 >> 0x7f,0) != '\0') ||
                  (local_1500 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(local_1500 >> 0xbf,0) != '\0') ||
                (local_1500 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                local_1500[0x1f] < '\0') {
              uStack_12f0 = 0;
              uStack_12ec = 0;
              uStack_12e8 = 0;
              uStack_12e4 = 0;
              local_1240 = local_1500;
              local_1160 = local_1120;
              auVar55 = vrcpps_avx(local_12c0);
              auVar102._8_4_ = 0x3f800000;
              auVar102._0_8_ = &DAT_3f8000003f800000;
              auVar102._12_4_ = 0x3f800000;
              auVar102._16_4_ = 0x3f800000;
              auVar102._20_4_ = 0x3f800000;
              auVar102._24_4_ = 0x3f800000;
              auVar102._28_4_ = 0x3f800000;
              auVar63 = vfnmadd213ps_fma(local_12c0,auVar55,auVar102);
              auVar63 = vfmadd132ps_fma(ZEXT1632(auVar63),auVar55,auVar55);
              auVar81._8_4_ = 0x219392ef;
              auVar81._0_8_ = 0x219392ef219392ef;
              auVar81._12_4_ = 0x219392ef;
              auVar81._16_4_ = 0x219392ef;
              auVar81._20_4_ = 0x219392ef;
              auVar81._24_4_ = 0x219392ef;
              auVar81._28_4_ = 0x219392ef;
              auVar55 = vcmpps_avx(local_1100,auVar81,5);
              auVar55 = vandps_avx(auVar55,ZEXT1632(auVar63));
              auVar28._4_4_ = local_1300._4_4_ * auVar55._4_4_;
              auVar28._0_4_ = local_1300._0_4_ * auVar55._0_4_;
              auVar28._8_4_ = local_1300._8_4_ * auVar55._8_4_;
              auVar28._12_4_ = local_1300._12_4_ * auVar55._12_4_;
              auVar28._16_4_ = auVar55._16_4_ * 0.0;
              auVar28._20_4_ = auVar55._20_4_ * 0.0;
              auVar28._24_4_ = auVar55._24_4_ * 0.0;
              auVar28._28_4_ = 0;
              auVar73 = vminps_avx(auVar28,auVar102);
              auVar29._4_4_ = auVar52._4_4_ * auVar55._4_4_;
              auVar29._0_4_ = auVar52._0_4_ * auVar55._0_4_;
              auVar29._8_4_ = auVar52._8_4_ * auVar55._8_4_;
              auVar29._12_4_ = auVar52._12_4_ * auVar55._12_4_;
              auVar29._16_4_ = auVar55._16_4_ * 0.0;
              auVar29._20_4_ = auVar55._20_4_ * 0.0;
              auVar29._24_4_ = auVar55._24_4_ * 0.0;
              auVar29._28_4_ = local_10a0._28_4_;
              auVar55 = vminps_avx(auVar29,auVar102);
              auVar61 = vsubps_avx(auVar102,auVar73);
              auVar74 = vsubps_avx(auVar102,auVar55);
              local_1200 = vblendvps_avx(auVar55,auVar61,local_1120);
              local_1220 = vblendvps_avx(auVar73,auVar74,local_1120);
              local_11c0[0] = local_12a0._0_4_ * (float)local_1140._0_4_;
              local_11c0[1] = local_12a0._4_4_ * (float)local_1140._4_4_;
              local_11c0[2] = local_12a0._8_4_ * fStack_1138;
              local_11c0[3] = local_12a0._12_4_ * fStack_1134;
              fStack_11b0 = local_12a0._16_4_ * fStack_1130;
              fStack_11ac = local_12a0._20_4_ * fStack_112c;
              fStack_11a8 = local_12a0._24_4_ * fStack_1128;
              uStack_11a4 = local_1220._28_4_;
              local_11a0[0] = (float)local_1140._0_4_ * local_1280._0_4_;
              local_11a0[1] = (float)local_1140._4_4_ * local_1280._4_4_;
              local_11a0[2] = fStack_1138 * local_1280._8_4_;
              local_11a0[3] = fStack_1134 * local_1280._12_4_;
              fStack_1190 = fStack_1130 * local_1280._16_4_;
              fStack_118c = fStack_112c * local_1280._20_4_;
              fStack_1188 = fStack_1128 * local_1280._24_4_;
              uStack_1184 = local_1200._28_4_;
              local_1180[0] = (float)local_1140._0_4_ * fVar99;
              local_1180[1] = (float)local_1140._4_4_ * fVar85;
              local_1180[2] = fStack_1138 * fVar86;
              local_1180[3] = fStack_1134 * fVar87;
              fStack_1170 = fStack_1130 * fVar88;
              fStack_116c = fStack_112c * fVar89;
              fStack_1168 = fStack_1128 * fVar90;
              uStack_1164 = uStack_1124;
              auVar55 = vpmovsxwd_avx2(auVar51);
              auVar68._8_4_ = 0x7f800000;
              auVar68._0_8_ = 0x7f8000007f800000;
              auVar68._12_4_ = 0x7f800000;
              auVar68._16_4_ = 0x7f800000;
              auVar68._20_4_ = 0x7f800000;
              auVar68._24_4_ = 0x7f800000;
              auVar68._28_4_ = 0x7f800000;
              auVar55 = vblendvps_avx(auVar68,local_11e0,auVar55);
              auVar73 = vshufps_avx(auVar55,auVar55,0xb1);
              auVar73 = vminps_avx(auVar55,auVar73);
              auVar61 = vshufpd_avx(auVar73,auVar73,5);
              auVar73 = vminps_avx(auVar73,auVar61);
              auVar61 = vpermpd_avx2(auVar73,0x4e);
              auVar73 = vminps_avx(auVar73,auVar61);
              auVar55 = vcmpps_avx(auVar55,auVar73,0);
              auVar52 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
              auVar52 = vpand_avx(auVar52,auVar51);
              auVar55 = vpmovsxwd_avx2(auVar52);
              if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar55 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar55 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar55 >> 0x7f,0) == '\0') &&
                    (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar55 >> 0xbf,0) == '\0') &&
                  (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar55[0x1f]) {
                auVar55 = local_1500;
              }
              uVar34 = vmovmskps_avx(auVar55);
              uVar35 = 0;
              for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x80000000) {
                uVar35 = uVar35 + 1;
              }
              auStack_1558 = auVar117._8_24_;
              local_1560 = context->scene;
              pSVar37 = context->scene;
              do {
                uVar39 = (ulong)uVar35;
                uVar35 = *(uint *)((long)&local_fc0 + uVar39 * 4);
                pGVar3 = (pSVar37->geometries).items[uVar35].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  *(undefined4 *)(local_1500 + uVar39 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar44 = *(undefined4 *)(local_1220 + uVar39 * 4);
                    uVar2 = *(undefined4 *)(local_1200 + uVar39 * 4);
                    *(float *)(ray + k * 4 + 0x80) = local_11c0[uVar39 - 8];
                    *(float *)(ray + k * 4 + 0xc0) = local_11c0[uVar39];
                    *(float *)(ray + k * 4 + 0xd0) = local_11a0[uVar39];
                    *(float *)(ray + k * 4 + 0xe0) = local_1180[uVar39];
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar44;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_13c0 + uVar39 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar35;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  uVar44 = *(undefined4 *)(local_1220 + uVar39 * 4);
                  local_1360._4_4_ = uVar44;
                  local_1360._0_4_ = uVar44;
                  local_1360._8_4_ = uVar44;
                  local_1360._12_4_ = uVar44;
                  uVar44 = *(undefined4 *)(local_1200 + uVar39 * 4);
                  auVar53._4_4_ = uVar44;
                  auVar53._0_4_ = uVar44;
                  auVar53._8_4_ = uVar44;
                  auVar53._12_4_ = uVar44;
                  local_1330._4_4_ = uVar35;
                  local_1330._0_4_ = uVar35;
                  local_1330._8_4_ = uVar35;
                  local_1330._12_4_ = uVar35;
                  uVar44 = *(undefined4 *)((long)&local_13c0 + uVar39 * 4);
                  auVar72._4_4_ = uVar44;
                  auVar72._0_4_ = uVar44;
                  auVar72._8_4_ = uVar44;
                  auVar72._12_4_ = uVar44;
                  fVar110 = local_11c0[uVar39];
                  fVar112 = local_11a0[uVar39];
                  local_1380._4_4_ = fVar112;
                  local_1380._0_4_ = fVar112;
                  local_1380._8_4_ = fVar112;
                  local_1380._12_4_ = fVar112;
                  fVar112 = local_1180[uVar39];
                  local_1370._4_4_ = fVar112;
                  local_1370._0_4_ = fVar112;
                  local_1370._8_4_ = fVar112;
                  local_1370._12_4_ = fVar112;
                  local_1390[0] = (RTCHitN)SUB41(fVar110,0);
                  local_1390[1] = (RTCHitN)(char)((uint)fVar110 >> 8);
                  local_1390[2] = (RTCHitN)(char)((uint)fVar110 >> 0x10);
                  local_1390[3] = (RTCHitN)(char)((uint)fVar110 >> 0x18);
                  local_1390[4] = (RTCHitN)SUB41(fVar110,0);
                  local_1390[5] = (RTCHitN)(char)((uint)fVar110 >> 8);
                  local_1390[6] = (RTCHitN)(char)((uint)fVar110 >> 0x10);
                  local_1390[7] = (RTCHitN)(char)((uint)fVar110 >> 0x18);
                  local_1390[8] = (RTCHitN)SUB41(fVar110,0);
                  local_1390[9] = (RTCHitN)(char)((uint)fVar110 >> 8);
                  local_1390[10] = (RTCHitN)(char)((uint)fVar110 >> 0x10);
                  local_1390[0xb] = (RTCHitN)(char)((uint)fVar110 >> 0x18);
                  local_1390[0xc] = (RTCHitN)SUB41(fVar110,0);
                  local_1390[0xd] = (RTCHitN)(char)((uint)fVar110 >> 8);
                  local_1390[0xe] = (RTCHitN)(char)((uint)fVar110 >> 0x10);
                  local_1390[0xf] = (RTCHitN)(char)((uint)fVar110 >> 0x18);
                  local_1350 = auVar53;
                  local_1340 = auVar72;
                  vpcmpeqd_avx2(ZEXT1632(local_1360),ZEXT1632(local_1360));
                  uStack_131c = context->user->instID[0];
                  local_1320 = uStack_131c;
                  uStack_1318 = uStack_131c;
                  uStack_1314 = uStack_131c;
                  uStack_1310 = context->user->instPrimID[0];
                  uStack_130c = uStack_1310;
                  uStack_1308 = uStack_1310;
                  uStack_1304 = uStack_1310;
                  local_1480._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  *(float *)(ray + k * 4 + 0x80) = local_11c0[uVar39 - 8];
                  local_1590 = *local_1580;
                  uStack_1588 = local_1580[1];
                  local_1530.valid = (int *)&local_1590;
                  local_1530.geometryUserPtr = pGVar3->userPtr;
                  local_1530.context = context->user;
                  local_1530.hit = local_1390;
                  local_1530.N = 4;
                  local_14c0 = auVar50._0_32_;
                  local_1530.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_14a0._0_8_ = pauVar43;
                    (*pGVar3->intersectionFilterN)(&local_1530);
                    auVar50._8_56_ = extraout_var;
                    auVar50._0_8_ = extraout_XMM1_Qa;
                    auVar53 = auVar50._0_16_;
                    auVar50 = ZEXT3264(local_14c0);
                    pauVar43 = (undefined1 (*) [16])local_14a0._0_8_;
                  }
                  auVar30._8_8_ = uStack_1588;
                  auVar30._0_8_ = local_1590;
                  if (auVar30 == (undefined1  [16])0x0) {
                    auVar52 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar51 = vpcmpeqd_avx(auVar53,auVar53);
                    auVar52 = auVar52 ^ auVar51;
                  }
                  else {
                    p_Var4 = context->args->filter;
                    auVar51 = vpcmpeqd_avx(auVar72,auVar72);
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var4)(&local_1530);
                      auVar50 = ZEXT3264(local_14c0);
                      auVar51 = vpcmpeqd_avx(auVar51,auVar51);
                    }
                    auVar31._8_8_ = uStack_1588;
                    auVar31._0_8_ = local_1590;
                    auVar63 = vpcmpeqd_avx(auVar31,_DAT_01feba10);
                    auVar52 = auVar63 ^ auVar51;
                    if (auVar31 != (undefined1  [16])0x0) {
                      auVar63 = auVar63 ^ auVar51;
                      auVar51 = vmaskmovps_avx(auVar63,*(undefined1 (*) [16])local_1530.hit);
                      *(undefined1 (*) [16])(local_1530.ray + 0xc0) = auVar51;
                      auVar51 = vmaskmovps_avx(auVar63,*(undefined1 (*) [16])(local_1530.hit + 0x10)
                                              );
                      *(undefined1 (*) [16])(local_1530.ray + 0xd0) = auVar51;
                      auVar51 = vmaskmovps_avx(auVar63,*(undefined1 (*) [16])(local_1530.hit + 0x20)
                                              );
                      *(undefined1 (*) [16])(local_1530.ray + 0xe0) = auVar51;
                      auVar51 = vmaskmovps_avx(auVar63,*(undefined1 (*) [16])(local_1530.hit + 0x30)
                                              );
                      *(undefined1 (*) [16])(local_1530.ray + 0xf0) = auVar51;
                      auVar51 = vmaskmovps_avx(auVar63,*(undefined1 (*) [16])(local_1530.hit + 0x40)
                                              );
                      *(undefined1 (*) [16])(local_1530.ray + 0x100) = auVar51;
                      auVar51 = vmaskmovps_avx(auVar63,*(undefined1 (*) [16])(local_1530.hit + 0x50)
                                              );
                      *(undefined1 (*) [16])(local_1530.ray + 0x110) = auVar51;
                      auVar51 = vmaskmovps_avx(auVar63,*(undefined1 (*) [16])(local_1530.hit + 0x60)
                                              );
                      *(undefined1 (*) [16])(local_1530.ray + 0x120) = auVar51;
                      auVar51 = vmaskmovps_avx(auVar63,*(undefined1 (*) [16])(local_1530.hit + 0x70)
                                              );
                      *(undefined1 (*) [16])(local_1530.ray + 0x130) = auVar51;
                      auVar51 = vmaskmovps_avx(auVar63,*(undefined1 (*) [16])(local_1530.hit + 0x80)
                                              );
                      *(undefined1 (*) [16])(local_1530.ray + 0x140) = auVar51;
                    }
                  }
                  auVar54._8_8_ = 0x100000001;
                  auVar54._0_8_ = 0x100000001;
                  if ((auVar54 & auVar52) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_1480._0_4_;
                  }
                  *(undefined4 *)(local_1500 + uVar39 * 4) = 0;
                  uVar44 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar49._4_4_ = uVar44;
                  auVar49._0_4_ = uVar44;
                  auVar49._8_4_ = uVar44;
                  auVar49._12_4_ = uVar44;
                  auVar49._16_4_ = uVar44;
                  auVar49._20_4_ = uVar44;
                  auVar49._24_4_ = uVar44;
                  auVar49._28_4_ = uVar44;
                  auVar55 = vcmpps_avx(auVar50._0_32_,auVar49,2);
                  local_1500 = vandps_avx(auVar55,local_1500);
                }
                if ((((((((local_1500 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_1500 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_1500 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_1500 >> 0x7f,0) == '\0') &&
                      (local_1500 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_1500 >> 0xbf,0) == '\0') &&
                    (local_1500 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_1500[0x1f]) break;
                auVar62._8_4_ = 0x7f800000;
                auVar62._0_8_ = 0x7f8000007f800000;
                auVar62._12_4_ = 0x7f800000;
                auVar62._16_4_ = 0x7f800000;
                auVar62._20_4_ = 0x7f800000;
                auVar62._24_4_ = 0x7f800000;
                auVar62._28_4_ = 0x7f800000;
                auVar55 = vblendvps_avx(auVar62,auVar50._0_32_,local_1500);
                auVar73 = vshufps_avx(auVar55,auVar55,0xb1);
                auVar73 = vminps_avx(auVar55,auVar73);
                auVar61 = vshufpd_avx(auVar73,auVar73,5);
                auVar73 = vminps_avx(auVar73,auVar61);
                auVar61 = vpermpd_avx2(auVar73,0x4e);
                auVar73 = vminps_avx(auVar73,auVar61);
                auVar73 = vcmpps_avx(auVar55,auVar73,0);
                auVar61 = local_1500 & auVar73;
                auVar55 = local_1500;
                if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar61 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar61 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar61 >> 0x7f,0) != '\0') ||
                      (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar61 >> 0xbf,0) != '\0') ||
                    (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar61[0x1f] < '\0') {
                  auVar55 = vandps_avx(auVar73,local_1500);
                }
                uVar34 = vmovmskps_avx(auVar55);
                uVar35 = 0;
                for (; pSVar37 = local_1560, (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x80000000) {
                  uVar35 = uVar35 + 1;
                }
              } while( true );
            }
          }
        }
        lVar40 = lVar40 + 1;
      } while (lVar40 != uVar45 - 8);
    }
    uVar44 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar50 = ZEXT1664(CONCAT412(uVar44,CONCAT48(uVar44,CONCAT44(uVar44,uVar44))));
    auVar96 = ZEXT1664(local_13d0);
    auVar98 = ZEXT1664(local_13e0);
    auVar103 = ZEXT1664(local_13f0);
    auVar92 = ZEXT1664(local_14d0);
    fVar110 = local_1400;
    fVar112 = fStack_13fc;
    fVar113 = fStack_13f8;
    fVar114 = fStack_13f4;
    fVar115 = local_1410;
    fVar118 = fStack_140c;
    fVar119 = fStack_1408;
    fVar99 = fStack_1404;
    fVar85 = local_1420;
    fVar86 = fStack_141c;
    fVar87 = fStack_1418;
    fVar88 = fStack_1414;
    fVar89 = local_1430;
    fVar90 = fStack_142c;
    fVar121 = fStack_1428;
    fVar122 = fStack_1424;
    fVar123 = local_1440;
    fVar125 = fStack_143c;
    fVar126 = fStack_1438;
    fVar127 = fStack_1434;
    fVar128 = local_1450;
    fVar130 = fStack_144c;
    fVar131 = fStack_1448;
    fVar132 = fStack_1444;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }